

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O0

FT_Error cid_face_init(FT_Stream stream,FT_Face cidface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  int iVar1;
  void *pvVar2;
  char *local_68;
  char *family;
  char *full;
  PS_FontInfo info;
  CID_FaceInfo cid;
  PSHinter_Service pshinter;
  PSAux_Service psaux;
  FT_Error error;
  CID_Face face;
  FT_Parameter *params_local;
  FT_Int num_params_local;
  FT_Int face_index_local;
  FT_Face cidface_local;
  FT_Stream stream_local;
  
  cidface->num_faces = 1;
  if (cidface[1].face_index == 0) {
    pvVar2 = FT_Get_Module_Interface((cidface->driver->root).library,"psaux");
    if (pvVar2 == (void *)0x0) {
      return 0xb;
    }
    cidface[1].face_index = (FT_Long)pvVar2;
  }
  if (cidface[2].bbox.yMin == 0) {
    pvVar2 = FT_Get_Module_Interface((cidface->driver->root).library,"pshinter");
    cidface[2].bbox.yMin = (FT_Pos)pvVar2;
  }
  psaux._4_4_ = FT_Stream_Seek(stream,0);
  if (((psaux._4_4_ == 0) &&
      (psaux._4_4_ = cid_face_open((CID_Face)cidface,face_index), psaux._4_4_ == 0)) &&
     (-1 < face_index)) {
    if ((face_index & 0xffffU) == 0) {
      cidface->num_glyphs = (FT_Long)cidface[2].available_sizes;
      cidface->num_charmaps = 0;
      cidface->face_index = (long)(int)(face_index & 0xffff);
      cidface->face_flags = cidface->face_flags | 0x811;
      if ((char)cidface[1].bbox.yMin != '\0') {
        cidface->face_flags = cidface->face_flags | 4;
      }
      cidface->family_name = (FT_String *)cidface[1].generic.data;
      cidface->style_name = "Regular";
      if (cidface->family_name == (FT_String *)0x0) {
        if (cidface[1].face_flags != 0) {
          cidface->family_name = (FT_String *)cidface[1].face_flags;
        }
      }
      else {
        family = (char *)cidface[1].charmaps;
        local_68 = cidface->family_name;
        if ((FT_CharMap *)family != (FT_CharMap *)0x0) {
          while (*family != '\0') {
            if (*family == *local_68) {
              local_68 = local_68 + 1;
              family = family + 1;
            }
            else if ((*family == ' ') || (*family == '-')) {
              family = family + 1;
            }
            else {
              if ((*local_68 != ' ') && (*local_68 != '-')) {
                if (*local_68 == '\0') {
                  cidface->style_name = family;
                }
                break;
              }
              local_68 = local_68 + 1;
            }
          }
        }
      }
      cidface->style_flags = 0;
      if (cidface[1].bbox.xMin != 0) {
        cidface->style_flags = cidface->style_flags | 1;
      }
      if ((cidface[1].generic.finalizer != (FT_Generic_Finalizer)0x0) &&
         ((iVar1 = strcmp((char *)cidface[1].generic.finalizer,"Bold"), iVar1 == 0 ||
          (iVar1 = strcmp((char *)cidface[1].generic.finalizer,"Black"), iVar1 == 0)))) {
        cidface->style_flags = cidface->style_flags | 2;
      }
      cidface->num_fixed_sizes = 0;
      cidface->available_sizes = (FT_Bitmap_Size *)0x0;
      (cidface->bbox).xMin = cidface[1].bbox.xMax >> 0x10;
      (cidface->bbox).yMin = cidface[1].bbox.yMax >> 0x10;
      (cidface->bbox).xMax = *(long *)&cidface[1].units_per_EM + 0xffff >> 0x10;
      (cidface->bbox).yMax = *(long *)&cidface[1].max_advance_width + 0xffff >> 0x10;
      if (cidface->units_per_EM == 0) {
        cidface->units_per_EM = 1000;
      }
      cidface->ascender = (FT_Short)(cidface->bbox).yMax;
      cidface->descender = (FT_Short)(cidface->bbox).yMin;
      cidface->height = (FT_Short)((ulong)((uint)cidface->units_per_EM * 0xc) / 10);
      if ((int)cidface->height < (int)cidface->ascender - (int)cidface->descender) {
        cidface->height = cidface->ascender - cidface->descender;
      }
      cidface->underline_position = *(FT_Short *)((long)&cidface[1].bbox.yMin + 2);
      cidface->underline_thickness = *(FT_Short *)((long)&cidface[1].bbox.yMin + 4);
    }
    else {
      psaux._4_4_ = 6;
    }
  }
  return psaux._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cid_face_init( FT_Stream      stream,
                 FT_Face        cidface,        /* CID_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    CID_Face          face = (CID_Face)cidface;
    FT_Error          error;
    PSAux_Service     psaux;
    PSHinter_Service  pshinter;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    cidface->num_faces = 1;

    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      psaux = (PSAux_Service)FT_Get_Module_Interface(
                FT_FACE_LIBRARY( face ), "psaux" );

      if ( !psaux )
      {
        FT_ERROR(( "cid_face_init: cannot access `psaux' module\n" ));
        error = FT_THROW( Missing_Module );
        goto Exit;
      }

      face->psaux = psaux;
    }

    pshinter = (PSHinter_Service)face->pshinter;
    if ( !pshinter )
    {
      pshinter = (PSHinter_Service)FT_Get_Module_Interface(
                   FT_FACE_LIBRARY( face ), "pshinter" );

      face->pshinter = pshinter;
    }

    FT_TRACE2(( "CID driver\n" ));

    /* open the tokenizer; this will also check the font format */
    if ( FT_STREAM_SEEK( 0 ) )
      goto Exit;

    error = cid_face_open( face, face_index );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    /* XXX: handle CID fonts with more than a single face */
    if ( ( face_index & 0xFFFF ) != 0 )
    {
      FT_ERROR(( "cid_face_init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* now load the font program into the face object */

    /* initialize the face object fields */

    /* set up root face fields */
    {
      CID_FaceInfo  cid  = &face->cid;
      PS_FontInfo   info = &cid->font_info;


      cidface->num_glyphs   = (FT_Long)cid->cid_count;
      cidface->num_charmaps = 0;

      cidface->face_index = face_index & 0xFFFF;

      cidface->face_flags |= FT_FACE_FLAG_SCALABLE   | /* scalable outlines */
                             FT_FACE_FLAG_HORIZONTAL | /* horizontal data   */
                             FT_FACE_FLAG_HINTER;      /* has native hinter */

      if ( info->is_fixed_pitch )
        cidface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* XXX: TODO: add kerning with .afm support */

      /* get style name -- be careful, some broken fonts only */
      /* have a /FontName dictionary entry!                   */
      cidface->family_name = info->family_name;
      /* assume "Regular" style if we don't know better */
      cidface->style_name = (char *)"Regular";
      if ( cidface->family_name )
      {
        char*  full   = info->full_name;
        char*  family = cidface->family_name;


        if ( full )
        {
          while ( *full )
          {
            if ( *full == *family )
            {
              family++;
              full++;
            }
            else
            {
              if ( *full == ' ' || *full == '-' )
                full++;
              else if ( *family == ' ' || *family == '-' )
                family++;
              else
              {
                if ( !*family )
                  cidface->style_name = full;
                break;
              }
            }
          }
        }
      }
      else
      {
        /* do we have a `/FontName'? */
        if ( cid->cid_font_name )
          cidface->family_name = cid->cid_font_name;
      }

      /* compute style flags */
      cidface->style_flags = 0;
      if ( info->italic_angle )
        cidface->style_flags |= FT_STYLE_FLAG_ITALIC;
      if ( info->weight )
      {
        if ( !ft_strcmp( info->weight, "Bold"  ) ||
             !ft_strcmp( info->weight, "Black" ) )
          cidface->style_flags |= FT_STYLE_FLAG_BOLD;
      }

      /* no embedded bitmap support */
      cidface->num_fixed_sizes = 0;
      cidface->available_sizes = NULL;

      cidface->bbox.xMin =   cid->font_bbox.xMin            >> 16;
      cidface->bbox.yMin =   cid->font_bbox.yMin            >> 16;
      /* no `U' suffix here to 0xFFFF! */
      cidface->bbox.xMax = ( cid->font_bbox.xMax + 0xFFFF ) >> 16;
      cidface->bbox.yMax = ( cid->font_bbox.yMax + 0xFFFF ) >> 16;

      if ( !cidface->units_per_EM )
        cidface->units_per_EM = 1000;

      cidface->ascender  = (FT_Short)( cidface->bbox.yMax );
      cidface->descender = (FT_Short)( cidface->bbox.yMin );

      cidface->height = (FT_Short)( ( cidface->units_per_EM * 12 ) / 10 );
      if ( cidface->height < cidface->ascender - cidface->descender )
        cidface->height = (FT_Short)( cidface->ascender - cidface->descender );

      cidface->underline_position  = (FT_Short)info->underline_position;
      cidface->underline_thickness = (FT_Short)info->underline_thickness;
    }

  Exit:
    return error;
  }